

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_device_write__pulse
                    (ma_device *pDevice,void *pPCMFrames,ma_uint32 frameCount,
                    ma_uint32 *pFramesWritten)

{
  ulong uVar1;
  void *pvVar2;
  ma_uint32 mVar3;
  ma_result mVar4;
  int iVar5;
  int local_a4;
  int error_2;
  int error_1;
  size_t bytesToMap;
  size_t writableSizeInBytes;
  ulong uStack_80;
  int error;
  size_t nbytes;
  void *pvStack_70;
  ma_uint32 framesToCopy;
  void *pSrc;
  void *pDst;
  int local_58;
  ma_uint32 mappedBufferFramesConsumed;
  ma_uint32 bpf;
  ma_uint32 totalFramesWritten;
  ma_uint32 *pFramesWritten_local;
  void *pvStack_40;
  ma_uint32 frameCount_local;
  void *pPCMFrames_local;
  ma_device *pDevice_local;
  void *local_28;
  int local_20;
  ma_format local_1c;
  int local_18;
  ma_format local_14;
  int local_10;
  ma_format local_c;
  
  _bpf = pFramesWritten;
  pFramesWritten_local._4_4_ = frameCount;
  pvStack_40 = pPCMFrames;
  pPCMFrames_local = pDevice;
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4db1,
                  "ma_result ma_device_write__pulse(ma_device *, const void *, ma_uint32, ma_uint32 *)"
                 );
  }
  if (pPCMFrames == (void *)0x0) {
    __assert_fail("pPCMFrames != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4db2,
                  "ma_result ma_device_write__pulse(ma_device *, const void *, ma_uint32, ma_uint32 *)"
                 );
  }
  if (frameCount == 0) {
    __assert_fail("frameCount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4db3,
                  "ma_result ma_device_write__pulse(ma_device *, const void *, ma_uint32, ma_uint32 *)"
                 );
  }
  if (pFramesWritten != (ma_uint32 *)0x0) {
    *pFramesWritten = 0;
  }
  mappedBufferFramesConsumed = 0;
  do {
    if (pFramesWritten_local._4_4_ <= mappedBufferFramesConsumed) {
LAB_0011a922:
      if (_bpf != (ma_uint32 *)0x0) {
        *_bpf = mappedBufferFramesConsumed;
      }
      return 0;
    }
    local_28 = pPCMFrames_local;
    if (*(int *)((long)pPCMFrames_local + 0x10) != 2) {
      return -0xca;
    }
    if ((*(long *)((long)pPCMFrames_local + 0x53a0) != 0) &&
       (*(int *)((long)pPCMFrames_local + 0x53b0) != 0)) {
      local_c = *(ma_format *)((long)pPCMFrames_local + 0x2f0);
      local_10 = *(int *)((long)pPCMFrames_local + 0x2f4);
      mVar3 = ma_get_bytes_per_sample(local_c);
      local_58 = mVar3 * local_10;
      pDst._4_4_ = *(int *)((long)pPCMFrames_local + 0x53b8) -
                   *(int *)((long)pPCMFrames_local + 0x53b0);
      pSrc = (void *)(*(long *)((long)pPCMFrames_local + 0x53a0) +
                     (ulong)(uint)(pDst._4_4_ * local_58));
      pvStack_70 = (void *)((long)pvStack_40 + (ulong)(mappedBufferFramesConsumed * local_58));
      if (*(uint *)((long)pPCMFrames_local + 0x53b0) <
          pFramesWritten_local._4_4_ - mappedBufferFramesConsumed) {
        local_a4 = *(int *)((long)pPCMFrames_local + 0x53b0);
      }
      else {
        local_a4 = pFramesWritten_local._4_4_ - mappedBufferFramesConsumed;
      }
      nbytes._4_4_ = local_a4;
      memcpy(pSrc,pvStack_70,(ulong)(uint)(local_a4 * local_58));
      *(int *)((long)pPCMFrames_local + 0x53b0) =
           *(int *)((long)pPCMFrames_local + 0x53b0) - nbytes._4_4_;
      mappedBufferFramesConsumed = nbytes._4_4_ + mappedBufferFramesConsumed;
    }
    if ((*(int *)((long)pPCMFrames_local + 0x53b8) != 0) &&
       (*(int *)((long)pPCMFrames_local + 0x53b0) == 0)) {
      iVar5 = *(int *)((long)pPCMFrames_local + 0x53b8);
      local_14 = *(ma_format *)((long)pPCMFrames_local + 0x2f0);
      local_18 = *(int *)((long)pPCMFrames_local + 0x2f4);
      mVar3 = ma_get_bytes_per_sample(local_14);
      uStack_80 = (ulong)(iVar5 * mVar3 * local_18);
      writableSizeInBytes._4_4_ =
           (**(code **)(*pPCMFrames_local + 0x248))
                     (*(undefined8 *)((long)pPCMFrames_local + 0x5388),
                      *(undefined8 *)((long)pPCMFrames_local + 0x53a0),uStack_80,0,0,0);
      pvVar2 = pPCMFrames_local;
      if (writableSizeInBytes._4_4_ < 0) {
        mVar4 = ma_result_from_pulse(writableSizeInBytes._4_4_);
        mVar4 = ma_post_error((ma_device *)pvVar2,1,
                              "[PulseAudio] Failed to write data to the PulseAudio stream.",mVar4);
        return mVar4;
      }
      *(undefined8 *)((long)pPCMFrames_local + 0x53a0) = 0;
      *(undefined4 *)((long)pPCMFrames_local + 0x53b0) = 0;
      *(undefined4 *)((long)pPCMFrames_local + 0x53b8) = 0;
    }
    if (pFramesWritten_local._4_4_ < mappedBufferFramesConsumed) {
      __assert_fail("totalFramesWritten <= frameCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x4dde,
                    "ma_result ma_device_write__pulse(ma_device *, const void *, ma_uint32, ma_uint32 *)"
                   );
    }
    if (mappedBufferFramesConsumed == pFramesWritten_local._4_4_) goto LAB_0011a922;
    while (iVar5 = (**(code **)(*pPCMFrames_local + 0x228))
                             (*(undefined8 *)((long)pPCMFrames_local + 0x5388)), iVar5 == 0) {
      bytesToMap = (**(code **)(*pPCMFrames_local + 0x260))
                             (*(undefined8 *)((long)pPCMFrames_local + 0x5388));
      if (bytesToMap == 0xffffffffffffffff) {
        mVar4 = ma_post_error((ma_device *)pPCMFrames_local,1,
                              "[PulseAudio] Failed to query the stream\'s writable size.",-1);
        return mVar4;
      }
      if (bytesToMap != 0) {
        _error_2 = bytesToMap;
        iVar5 = (**(code **)(*pPCMFrames_local + 0x240))
                          (*(undefined8 *)((long)pPCMFrames_local + 0x5388),
                           (long)pPCMFrames_local + 0x53a0,&error_2);
        pvVar2 = pPCMFrames_local;
        uVar1 = _error_2;
        if (iVar5 < 0) {
          mVar4 = ma_result_from_pulse(iVar5);
          mVar4 = ma_post_error((ma_device *)pvVar2,1,"[PulseAudio] Failed to map write buffer.",
                                mVar4);
          return mVar4;
        }
        local_1c = *(ma_format *)((long)pPCMFrames_local + 0x2f0);
        local_20 = *(int *)((long)pPCMFrames_local + 0x2f4);
        mVar3 = ma_get_bytes_per_sample(local_1c);
        *(int *)((long)pPCMFrames_local + 0x53b8) = (int)(uVar1 / (mVar3 * local_20));
        *(undefined4 *)((long)pPCMFrames_local + 0x53b0) =
             *(undefined4 *)((long)pPCMFrames_local + 0x53b8);
        break;
      }
      iVar5 = (**(code **)(*pPCMFrames_local + 0x128))
                        (*(undefined8 *)((long)pPCMFrames_local + 0x5370),1,0);
      if (iVar5 < 0) {
        mVar4 = ma_result_from_pulse(iVar5);
        return mVar4;
      }
    }
  } while( true );
}

Assistant:

static ma_result ma_device_write__pulse(ma_device* pDevice, const void* pPCMFrames, ma_uint32 frameCount, ma_uint32* pFramesWritten)
{
    ma_uint32 totalFramesWritten;

    MA_ASSERT(pDevice != NULL);
    MA_ASSERT(pPCMFrames != NULL);
    MA_ASSERT(frameCount > 0);

    if (pFramesWritten != NULL) {
        *pFramesWritten = 0;
    }

    totalFramesWritten = 0;
    while (totalFramesWritten < frameCount) {
        if (ma_device__get_state(pDevice) != MA_STATE_STARTED) {
            return MA_DEVICE_NOT_STARTED;
        }

        /* Place the data into the mapped buffer if we have one. */
        if (pDevice->pulse.pMappedBufferPlayback != NULL && pDevice->pulse.mappedBufferFramesRemainingPlayback > 0) {
            ma_uint32 bpf = ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
            ma_uint32 mappedBufferFramesConsumed = pDevice->pulse.mappedBufferFramesCapacityPlayback - pDevice->pulse.mappedBufferFramesRemainingPlayback;

            void* pDst = (ma_uint8*)pDevice->pulse.pMappedBufferPlayback + (mappedBufferFramesConsumed * bpf);
            const void* pSrc = (const ma_uint8*)pPCMFrames + (totalFramesWritten * bpf);
            ma_uint32  framesToCopy = ma_min(pDevice->pulse.mappedBufferFramesRemainingPlayback, (frameCount - totalFramesWritten));
            MA_COPY_MEMORY(pDst, pSrc, framesToCopy * bpf);

            pDevice->pulse.mappedBufferFramesRemainingPlayback -= framesToCopy;
            totalFramesWritten += framesToCopy;
        }

        /*
        Getting here means we've run out of data in the currently mapped chunk. We need to write this to the device and then try
        mapping another chunk. If this fails we need to wait for space to become available.
        */
        if (pDevice->pulse.mappedBufferFramesCapacityPlayback > 0 && pDevice->pulse.mappedBufferFramesRemainingPlayback == 0) {
            size_t nbytes = pDevice->pulse.mappedBufferFramesCapacityPlayback * ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);

            int error = ((ma_pa_stream_write_proc)pDevice->pContext->pulse.pa_stream_write)((ma_pa_stream*)pDevice->pulse.pStreamPlayback, pDevice->pulse.pMappedBufferPlayback, nbytes, NULL, 0, MA_PA_SEEK_RELATIVE);
            if (error < 0) {
                return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to write data to the PulseAudio stream.", ma_result_from_pulse(error));
            }

            pDevice->pulse.pMappedBufferPlayback = NULL;
            pDevice->pulse.mappedBufferFramesRemainingPlayback = 0;
            pDevice->pulse.mappedBufferFramesCapacityPlayback = 0;
        }

        MA_ASSERT(totalFramesWritten <= frameCount);
        if (totalFramesWritten == frameCount) {
            break;
        }

        /* Getting here means we need to map a new buffer. If we don't have enough space we need to wait for more. */
        for (;;) {
            size_t writableSizeInBytes;

            /* If the device has been corked, don't try to continue. */
            if (((ma_pa_stream_is_corked_proc)pDevice->pContext->pulse.pa_stream_is_corked)((ma_pa_stream*)pDevice->pulse.pStreamPlayback)) {
                break;
            }

            writableSizeInBytes = ((ma_pa_stream_writable_size_proc)pDevice->pContext->pulse.pa_stream_writable_size)((ma_pa_stream*)pDevice->pulse.pStreamPlayback);
            if (writableSizeInBytes != (size_t)-1) {
                if (writableSizeInBytes > 0) {
                    /* Data is avaialable. */
                    size_t bytesToMap = writableSizeInBytes;
                    int error = ((ma_pa_stream_begin_write_proc)pDevice->pContext->pulse.pa_stream_begin_write)((ma_pa_stream*)pDevice->pulse.pStreamPlayback, &pDevice->pulse.pMappedBufferPlayback, &bytesToMap);
                    if (error < 0) {
                        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to map write buffer.", ma_result_from_pulse(error));
                    }

                    pDevice->pulse.mappedBufferFramesCapacityPlayback  = bytesToMap / ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
                    pDevice->pulse.mappedBufferFramesRemainingPlayback = pDevice->pulse.mappedBufferFramesCapacityPlayback;

                    break;
                } else {
                    /* No data available. Need to wait for more. */
                    int error = ((ma_pa_mainloop_iterate_proc)pDevice->pContext->pulse.pa_mainloop_iterate)((ma_pa_mainloop*)pDevice->pulse.pMainLoop, 1, NULL);
                    if (error < 0) {
                        return ma_result_from_pulse(error);
                    }

                    continue;
                }
            } else {
                return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to query the stream's writable size.", MA_ERROR);
            }
        }
    }

    if (pFramesWritten != NULL) {
        *pFramesWritten = totalFramesWritten;
    }

    return MA_SUCCESS;
}